

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockBuilderCopyDockSpace
               (ImGuiID src_dockspace_id,ImGuiID dst_dockspace_id,
               ImVector<const_char_*> *in_window_remap_pairs)

{
  char *data_p;
  char *dst_name;
  ImU32 *pIVar1;
  undefined8 *puVar2;
  ImGuiContext *pIVar3;
  ImU32 IVar4;
  int *piVar5;
  void *pvVar6;
  ImU32 *pIVar7;
  int iVar8;
  ImU32 *pIVar9;
  int iVar10;
  ImGuiContext *g;
  ImGuiID IVar11;
  ulong uVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  ImVector<unsigned_int> src_windows;
  ImVector<unsigned_int> node_remap_pairs;
  int local_58;
  int iStack_54;
  int *piStack_50;
  ImVector<unsigned_int> local_48;
  ImVector<const_char_*> *local_38;
  
  local_48.Size = 0;
  local_48.Capacity = 0;
  local_48.Data = (uint *)0x0;
  DockBuilderCopyNode(src_dockspace_id,dst_dockspace_id,&local_48);
  local_58 = 0;
  iStack_54 = 0;
  piStack_50 = (int *)0x0;
  if (0 < *(int *)in_window_remap_pairs) {
    lVar15 = 0;
    local_38 = in_window_remap_pairs;
    do {
      data_p = *(char **)(*(long *)(in_window_remap_pairs + 8) + lVar15 * 8);
      dst_name = *(char **)(*(long *)(in_window_remap_pairs + 8) + 8 + lVar15 * 8);
      IVar4 = ImHashStr(data_p,0,0);
      piVar5 = piStack_50;
      if (local_58 == iStack_54) {
        if (iStack_54 == 0) {
          iVar8 = 8;
        }
        else {
          iVar8 = iStack_54 / 2 + iStack_54;
        }
        iVar10 = local_58 + 1;
        if (local_58 + 1 < iVar8) {
          iVar10 = iVar8;
        }
        if (iStack_54 < iVar10) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar5 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar5 = *piVar5 + 1;
          }
          piVar5 = (int *)(*GImAllocatorAllocFunc)((long)iVar10 << 2,GImAllocatorUserData);
          in_window_remap_pairs = local_38;
          iStack_54 = iVar10;
          if (piStack_50 != (int *)0x0) {
            memcpy(piVar5,piStack_50,(long)local_58 << 2);
            if ((piStack_50 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar13 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar13 = *piVar13 + -1;
            }
            (*GImAllocatorFreeFunc)(piStack_50,GImAllocatorUserData);
            in_window_remap_pairs = local_38;
          }
        }
      }
      piStack_50 = piVar5;
      piStack_50[local_58] = IVar4;
      pIVar3 = GImGui;
      local_58 = local_58 + 1;
      pvVar6 = ImGuiStorage::GetVoidPtr(&GImGui->WindowsById,IVar4);
      if (pvVar6 == (void *)0x0) {
        pIVar1 = (ImU32 *)(pIVar3->SettingsWindows).Buf.Data;
        pIVar9 = pIVar1 + 1;
        pIVar7 = pIVar1;
        if (pIVar1 != (ImU32 *)0x0) {
          do {
            pIVar7 = pIVar9;
            if (*pIVar9 == IVar4) break;
            pIVar9 = (ImU32 *)((long)(int)pIVar9[-1] + (long)pIVar9);
            pIVar7 = (ImU32 *)0x0;
          } while (pIVar9 != (ImU32 *)((long)(pIVar3->SettingsWindows).Buf.Size + (long)(pIVar1 + 1)
                                      ));
        }
        if (pIVar7 == (ImU32 *)0x0) {
          IVar4 = 0;
        }
        else {
          IVar4 = pIVar7[5];
        }
      }
      else {
        IVar4 = *(ImU32 *)((long)pvVar6 + 0x420);
      }
      IVar11 = 0;
      if (0 < local_48.Size) {
        uVar12 = 0;
        do {
          if (local_48.Data[uVar12] == IVar4) {
            IVar11 = *(ImGuiID *)((long)local_48.Data + ((uVar12 & 0xffffffff) << 2 | 4));
            break;
          }
          uVar12 = uVar12 + 2;
        } while ((int)uVar12 < local_48.Size);
      }
      if (IVar11 == 0) {
        DockBuilderCopyWindowSettings(data_p,dst_name);
      }
      else {
        DockBuilderDockWindow(dst_name,IVar11);
      }
      lVar15 = lVar15 + 2;
    } while ((int)lVar15 < *(int *)in_window_remap_pairs);
  }
  if (0 < local_48.Size) {
    lVar15 = 0;
    do {
      if (local_48.Data[lVar15] != 0) {
        IVar11 = local_48.Data[lVar15 + 1];
        pvVar6 = ImGuiStorage::GetVoidPtr(&GImGui->DockContext->Nodes,local_48.Data[lVar15]);
        if (0 < *(int *)((long)pvVar6 + 0x28)) {
          lVar14 = 0;
          do {
            puVar2 = *(undefined8 **)(*(long *)((long)pvVar6 + 0x30) + lVar14 * 8);
            piVar5 = piStack_50;
            do {
              piVar13 = piVar5;
              if (piStack_50 + local_58 <= piVar13) goto LAB_0016a085;
              piVar5 = piVar13 + 1;
            } while (*piVar13 != *(int *)(puVar2 + 1));
            if (piStack_50 + local_58 <= piVar13) {
LAB_0016a085:
              DockBuilderDockWindow((char *)*puVar2,IVar11);
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < *(int *)((long)pvVar6 + 0x28));
        }
      }
      lVar15 = lVar15 + 2;
    } while ((int)lVar15 < local_48.Size);
  }
  if (piStack_50 != (int *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar5 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar5 = *piVar5 + -1;
    }
    (*GImAllocatorFreeFunc)(piStack_50,GImAllocatorUserData);
  }
  if (local_48.Data != (uint *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar5 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar5 = *piVar5 + -1;
    }
    (*GImAllocatorFreeFunc)(local_48.Data,GImAllocatorUserData);
  }
  return;
}

Assistant:

void ImGui::DockBuilderCopyDockSpace(ImGuiID src_dockspace_id, ImGuiID dst_dockspace_id, ImVector<const char*>* in_window_remap_pairs)
{
    IM_ASSERT(src_dockspace_id != 0);
    IM_ASSERT(dst_dockspace_id != 0);
    IM_ASSERT(in_window_remap_pairs != NULL);
    IM_ASSERT((in_window_remap_pairs->Size % 2) == 0);

    // Duplicate entire dock
    // FIXME: When overwriting dst_dockspace_id, windows that aren't part of our dockspace window class but that are docked in a same node will be split apart,
    // whereas we could attempt to at least keep them together in a new, same floating node.
    ImVector<ImGuiID> node_remap_pairs;
    DockBuilderCopyNode(src_dockspace_id, dst_dockspace_id, &node_remap_pairs);

    // Attempt to transition all the upcoming windows associated to dst_dockspace_id into the newly created hierarchy of dock nodes
    // (The windows associated to src_dockspace_id are staying in place)
    ImVector<ImGuiID> src_windows;
    for (int remap_window_n = 0; remap_window_n < in_window_remap_pairs->Size; remap_window_n += 2)
    {
        const char* src_window_name = (*in_window_remap_pairs)[remap_window_n];
        const char* dst_window_name = (*in_window_remap_pairs)[remap_window_n + 1];
        ImGuiID src_window_id = ImHashStr(src_window_name);
        src_windows.push_back(src_window_id);

        // Search in the remapping tables
        ImGuiID src_dock_id = 0;
        if (ImGuiWindow* src_window = FindWindowByID(src_window_id))
            src_dock_id = src_window->DockId;
        else if (ImGuiWindowSettings* src_window_settings = FindWindowSettings(src_window_id))
            src_dock_id = src_window_settings->DockId;
        ImGuiID dst_dock_id = 0;
        for (int dock_remap_n = 0; dock_remap_n < node_remap_pairs.Size; dock_remap_n += 2)
            if (node_remap_pairs[dock_remap_n] == src_dock_id)
            {
                dst_dock_id = node_remap_pairs[dock_remap_n + 1];
                //node_remap_pairs[dock_remap_n] = node_remap_pairs[dock_remap_n + 1] = 0; // Clear
                break;
            }

        if (dst_dock_id != 0)
        {
            // Docked windows gets redocked into the new node hierarchy.
            IMGUI_DEBUG_LOG_DOCKING("Remap live window '%s' 0x%08X -> '%s' 0x%08X\n", src_window_name, src_dock_id, dst_window_name, dst_dock_id);
            DockBuilderDockWindow(dst_window_name, dst_dock_id);
        }
        else
        {
            // Floating windows gets their settings transferred (regardless of whether the new window already exist or not)
            // When this is leading to a Copy and not a Move, we would get two overlapping floating windows. Could we possibly dock them together?
            IMGUI_DEBUG_LOG_DOCKING("Remap window settings '%s' -> '%s'\n", src_window_name, dst_window_name);
            DockBuilderCopyWindowSettings(src_window_name, dst_window_name);
        }
    }

    // Anything else in the source nodes of 'node_remap_pairs' are windows that were docked in src_dockspace_id but are not owned by it (unaffiliated windows, e.g. "ImGui Demo")
    // Find those windows and move to them to the cloned dock node. This may be optional?
    for (int dock_remap_n = 0; dock_remap_n < node_remap_pairs.Size; dock_remap_n += 2)
        if (ImGuiID src_dock_id = node_remap_pairs[dock_remap_n])
        {
            ImGuiID dst_dock_id = node_remap_pairs[dock_remap_n + 1];
            ImGuiDockNode* node = DockBuilderGetNode(src_dock_id);
            for (int window_n = 0; window_n < node->Windows.Size; window_n++)
            {
                ImGuiWindow* window = node->Windows[window_n];
                if (src_windows.contains(window->ID))
                    continue;

                // Docked windows gets redocked into the new node hierarchy.
                IMGUI_DEBUG_LOG_DOCKING("Remap window '%s' %08X -> %08X\n", window->Name, src_dock_id, dst_dock_id);
                DockBuilderDockWindow(window->Name, dst_dock_id);
            }
        }
}